

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O3

void printf_test(void)

{
  short sVar1;
  ushort uVar2;
  array_container_t *container;
  uint16_t *puVar3;
  long lVar4;
  int32_t iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  container = array_container_create();
  _assert_true((unsigned_long)container,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x17);
  iVar5 = container->cardinality;
  if (((long)iVar5 == 0) ||
     ((puVar3 = container->array, iVar5 != 0x7fffffff && (puVar3[(long)iVar5 + -1] == 0)))) {
    if (iVar5 == container->capacity) {
      array_container_grow(container,iVar5 + 1,true);
      iVar5 = container->cardinality;
    }
    puVar3 = container->array;
    lVar4 = (long)iVar5;
    iVar5 = iVar5 + 1;
    container->cardinality = iVar5;
    puVar3[lVar4] = 1;
LAB_00103e29:
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      bVar10 = iVar5 == 0x7fffffff;
      if ((bVar10) || (1 < puVar3[(long)iVar5 + -1])) {
        if (0 < iVar5) goto LAB_00103e4a;
        uVar9 = 0;
        goto LAB_00103ec3;
      }
    }
    if (iVar5 == container->capacity) {
      array_container_grow(container,iVar5 + 1,true);
      iVar5 = container->cardinality;
      puVar3 = container->array;
    }
    lVar4 = (long)iVar5;
    iVar5 = iVar5 + 1;
    container->cardinality = iVar5;
    puVar3[lVar4] = 2;
LAB_00103f0f:
    if (iVar5 != 0) goto LAB_00103f14;
    iVar5 = 0;
LAB_00103f80:
    if (iVar5 == container->capacity) {
      array_container_grow(container,iVar5 + 1,true);
      iVar5 = container->cardinality;
      puVar3 = container->array;
    }
    lVar4 = (long)iVar5;
    iVar5 = iVar5 + 1;
    container->cardinality = iVar5;
    puVar3[lVar4] = 3;
LAB_00104003:
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      bVar10 = iVar5 == 0x7fffffff;
      if ((bVar10) || (9 < puVar3[(long)iVar5 + -1])) {
        if (0 < iVar5) goto LAB_00104024;
        uVar9 = 0;
        goto LAB_0010409d;
      }
    }
    if (iVar5 == container->capacity) {
      array_container_grow(container,iVar5 + 1,true);
      iVar5 = container->cardinality;
      puVar3 = container->array;
    }
    lVar4 = (long)iVar5;
    iVar5 = iVar5 + 1;
    container->cardinality = iVar5;
    puVar3[lVar4] = 10;
LAB_001040e9:
    if (iVar5 != 0) goto LAB_001040ee;
    iVar5 = 0;
  }
  else {
    if (iVar5 < 1) {
      uVar9 = 0;
LAB_00103ddd:
      if (iVar5 == container->capacity) {
        array_container_grow(container,iVar5 + 1,true);
        puVar3 = container->array;
      }
      memmove(puVar3 + uVar9 + 1,puVar3 + uVar9,(long)(iVar5 - (int)uVar9) * 2);
      puVar3 = container->array;
      puVar3[uVar9] = 1;
      iVar5 = container->cardinality + 1;
      container->cardinality = iVar5;
      goto LAB_00103e29;
    }
    iVar6 = iVar5 + -1;
    uVar9 = 0;
    do {
      uVar8 = iVar6 + (int)uVar9;
      uVar7 = uVar8 >> 1;
      sVar1 = *(short *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
      if (sVar1 == 0) {
        uVar9 = (ulong)(uVar7 + 1);
      }
      else {
        if (sVar1 == 1) goto LAB_00103e29;
        iVar6 = uVar7 - 1;
      }
    } while ((int)uVar9 <= iVar6);
    if (iVar5 != 0x7fffffff) goto LAB_00103ddd;
    bVar10 = true;
    iVar5 = 0x7fffffff;
LAB_00103e4a:
    iVar6 = iVar5 + -1;
    uVar9 = 0;
    do {
      uVar8 = iVar6 + (int)uVar9;
      uVar7 = uVar8 >> 1;
      uVar2 = *(ushort *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
      if (uVar2 < 2) {
        uVar9 = (ulong)(uVar7 + 1);
      }
      else {
        if (uVar2 == 2) goto LAB_00103f14;
        iVar6 = uVar7 - 1;
      }
    } while ((int)uVar9 <= iVar6);
    if (!bVar10) {
LAB_00103ec3:
      if (iVar5 == container->capacity) {
        array_container_grow(container,iVar5 + 1,true);
        puVar3 = container->array;
      }
      memmove(puVar3 + uVar9 + 1,puVar3 + uVar9,(long)(iVar5 - (int)uVar9) * 2);
      puVar3 = container->array;
      puVar3[uVar9] = 2;
      iVar5 = container->cardinality + 1;
      container->cardinality = iVar5;
      goto LAB_00103f0f;
    }
LAB_00103f14:
    if ((iVar5 != 0x7fffffff) && (puVar3[(long)iVar5 + -1] < 3)) goto LAB_00103f80;
    if (iVar5 < 1) {
      uVar9 = 0;
LAB_00103fb7:
      if (iVar5 == container->capacity) {
        array_container_grow(container,iVar5 + 1,true);
        puVar3 = container->array;
      }
      memmove(puVar3 + uVar9 + 1,puVar3 + uVar9,(long)(iVar5 - (int)uVar9) * 2);
      puVar3 = container->array;
      puVar3[uVar9] = 3;
      iVar5 = container->cardinality + 1;
      container->cardinality = iVar5;
      goto LAB_00104003;
    }
    iVar6 = iVar5 + -1;
    uVar9 = 0;
    do {
      uVar8 = iVar6 + (int)uVar9;
      uVar7 = uVar8 >> 1;
      uVar2 = *(ushort *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
      if (uVar2 < 3) {
        uVar9 = (ulong)(uVar7 + 1);
      }
      else {
        if (uVar2 == 3) goto LAB_00104003;
        iVar6 = uVar7 - 1;
      }
    } while ((int)uVar9 <= iVar6);
    if (iVar5 != 0x7fffffff) goto LAB_00103fb7;
    bVar10 = true;
    iVar5 = 0x7fffffff;
LAB_00104024:
    iVar6 = iVar5 + -1;
    uVar9 = 0;
    do {
      uVar8 = iVar6 + (int)uVar9;
      uVar7 = uVar8 >> 1;
      uVar2 = *(ushort *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
      if (uVar2 < 10) {
        uVar9 = (ulong)(uVar7 + 1);
      }
      else {
        if (uVar2 == 10) goto LAB_001040ee;
        iVar6 = uVar7 - 1;
      }
    } while ((int)uVar9 <= iVar6);
    if (!bVar10) {
LAB_0010409d:
      if (iVar5 == container->capacity) {
        array_container_grow(container,iVar5 + 1,true);
        puVar3 = container->array;
      }
      memmove(puVar3 + uVar9 + 1,puVar3 + uVar9,(long)(iVar5 - (int)uVar9) * 2);
      puVar3 = container->array;
      puVar3[uVar9] = 10;
      iVar5 = container->cardinality + 1;
      container->cardinality = iVar5;
      goto LAB_001040e9;
    }
LAB_001040ee:
    if ((iVar5 == 0x7fffffff) || (9999 < puVar3[(long)iVar5 + -1])) {
      if (iVar5 < 1) {
        uVar7 = 0;
      }
      else {
        iVar6 = iVar5 + -1;
        uVar7 = 0;
        do {
          uVar8 = iVar6 + uVar7 >> 1;
          uVar2 = *(ushort *)((long)puVar3 + (ulong)(iVar6 + uVar7 & 0xfffffffe));
          if (uVar2 < 10000) {
            uVar7 = uVar8 + 1;
          }
          else {
            if (uVar2 == 10000) goto LAB_001041d0;
            iVar6 = uVar8 - 1;
          }
        } while ((int)uVar7 <= iVar6);
        if (iVar5 == 0x7fffffff) goto LAB_001041d0;
      }
      if (iVar5 == container->capacity) {
        array_container_grow(container,iVar5 + 1,true);
        puVar3 = container->array;
      }
      memmove(puVar3 + (ulong)uVar7 + 1,puVar3 + uVar7,(long)(int)(iVar5 - uVar7) * 2);
      container->array[uVar7] = 10000;
      container->cardinality = container->cardinality + 1;
      goto LAB_001041d0;
    }
  }
  if (iVar5 == container->capacity) {
    array_container_grow(container,iVar5 + 1,true);
    iVar5 = container->cardinality;
    puVar3 = container->array;
  }
  container->cardinality = iVar5 + 1;
  puVar3[iVar5] = 10000;
LAB_001041d0:
  array_container_printf(container);
  putchar(10);
  array_container_free(container);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    array_container_t* B = array_container_create();
    assert_non_null(B);

    array_container_add(B, 1U);
    array_container_add(B, 2U);
    array_container_add(B, 3U);
    array_container_add(B, 10U);
    array_container_add(B, 10000U);

    array_container_printf(B);
    printf("\n");

    array_container_free(B);
}